

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O2

void __thiscall TTD::TextFormatWriter::WriteSeparator(TextFormatWriter *this,Separator separator)

{
  uint32 i;
  uint32 i_1;
  uint uVar1;
  
  if ((separator & CommaSeparator) != NoSeparator) {
    FileWriter::WriteRawChar(&this->super_FileWriter,L',');
    if ((separator & BigSpaceSeparator) == NoSeparator) {
      FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
    }
    else {
      FileWriter::WriteRawChar(&this->super_FileWriter,L'\n');
      for (uVar1 = 0; uVar1 < this->m_indentSize; uVar1 = uVar1 + 1) {
        FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
        FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
      }
    }
  }
  if (separator == BigSpaceSeparator) {
    FileWriter::WriteRawChar(&this->super_FileWriter,L'\n');
    for (uVar1 = 0; uVar1 < this->m_indentSize; uVar1 = uVar1 + 1) {
      FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
      FileWriter::WriteRawChar(&this->super_FileWriter,L' ');
    }
  }
  return;
}

Assistant:

void TextFormatWriter::WriteSeparator(NSTokens::Separator separator)
    {
        if((separator & NSTokens::Separator::CommaSeparator) == NSTokens::Separator::CommaSeparator)
        {
            this->WriteRawChar(_u(','));

            if((separator & NSTokens::Separator::BigSpaceSeparator) == NSTokens::Separator::BigSpaceSeparator)
            {
                this->WriteRawChar(_u('\n'));
                for(uint32 i = 0; i < this->m_indentSize; ++i)
                {
                    this->WriteRawChar(_u(' '));
                    this->WriteRawChar(_u(' '));
                }
            }
            else
            {
                this->WriteRawChar(_u(' '));
            }
        }

        if(separator == NSTokens::Separator::BigSpaceSeparator)
        {
            this->WriteRawChar(_u('\n'));
            for(uint32 i = 0; i < this->m_indentSize; ++i)
            {
                this->WriteRawChar(_u(' '));
                this->WriteRawChar(_u(' '));
            }
        }
    }